

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O2

bool QSslSocketPrivate::isMatchingHostname(QSslCertificate *cert,QString *peerName)

{
  long lVar1;
  bool bVar2;
  const_iterator cVar3;
  long lVar4;
  const_iterator it;
  const_iterator it_1;
  QString *commonName;
  QString *cn;
  long in_FS_OFFSET;
  bool bVar5;
  pair<QMultiMap<QSsl::AlternativeNameEntryType,_QString>::const_iterator,_QMultiMap<QSsl::AlternativeNameEntryType,_QString>::const_iterator>
  pVar6;
  AlternativeNameEntryType local_84;
  QMultiMap<QSsl::AlternativeNameEntryType,_QString> subjectAlternativeNames;
  QArrayDataPointer<QString> local_78;
  QMultiMap<QSsl::AlternativeNameEntryType,_QString> subjectAlternativeNames_1;
  QHostAddress hostAddress;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  hostAddress.d.d.ptr = (QExplicitlySharedDataPointer<QHostAddressPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QHostAddress::QHostAddress(&hostAddress,peerName);
  bVar2 = QHostAddress::isNull(&hostAddress);
  if (!bVar2) {
    subjectAlternativeNames_1.d.d.ptr =
         (QExplicitlySharedDataPointerV2<QMapData<std::multimap<QSsl::AlternativeNameEntryType,_QString,_std::less<QSsl::AlternativeNameEntryType>,_std::allocator<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_>_>_>_>
          )&DAT_aaaaaaaaaaaaaaaa;
    QSslCertificate::subjectAlternativeNames((QSslCertificate *)&subjectAlternativeNames_1);
    local_78.d = (Data *)CONCAT44(local_78.d._4_4_,2);
    pVar6 = QMultiMap<QSsl::AlternativeNameEntryType,_QString>::equal_range
                      (&subjectAlternativeNames_1,(AlternativeNameEntryType *)&local_78);
    for (cVar3._M_node = (_Base_ptr)pVar6.first.i._M_node;
        (const_iterator)cVar3._M_node != pVar6.second.i._M_node.i;
        cVar3._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar3._M_node)) {
      QHostAddress::QHostAddress((QHostAddress *)&local_78,(QString *)&cVar3._M_node[1]._M_parent);
      bVar2 = QHostAddress::isEqual((QHostAddress *)&local_78,&hostAddress,(ConversionMode)0x0);
      QHostAddress::~QHostAddress((QHostAddress *)&local_78);
      if (bVar2) {
        QtPrivate::
        QExplicitlySharedDataPointerV2<QMapData<std::multimap<QSsl::AlternativeNameEntryType,_QString,_std::less<QSsl::AlternativeNameEntryType>,_std::allocator<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_>_>_>_>
        ::~QExplicitlySharedDataPointerV2(&subjectAlternativeNames_1.d);
        bVar2 = true;
        goto LAB_002343df;
      }
    }
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::multimap<QSsl::AlternativeNameEntryType,_QString,_std::less<QSsl::AlternativeNameEntryType>,_std::allocator<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2(&subjectAlternativeNames_1.d);
  }
  subjectAlternativeNames_1.d.d.ptr =
       (QExplicitlySharedDataPointerV2<QMapData<std::multimap<QSsl::AlternativeNameEntryType,_QString,_std::less<QSsl::AlternativeNameEntryType>,_std::allocator<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_>_>_>_>
        )&DAT_aaaaaaaaaaaaaaaa;
  QUrl::toAce(&local_78,peerName,0);
  QString::fromLatin1<void>((QString *)&subjectAlternativeNames_1,(QByteArray *)&local_78);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_78);
  local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  QSslCertificate::subjectInfo((QStringList *)&local_78,cert,CommonName);
  lVar4 = local_78.size * 0x18;
  cn = local_78.ptr;
  do {
    if (lVar4 == 0) {
      subjectAlternativeNames.d.d.ptr =
           (QExplicitlySharedDataPointerV2<QMapData<std::multimap<QSsl::AlternativeNameEntryType,_QString,_std::less<QSsl::AlternativeNameEntryType>,_std::allocator<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_>_>_>_>
            )&DAT_aaaaaaaaaaaaaaaa;
      QSslCertificate::subjectAlternativeNames((QSslCertificate *)&subjectAlternativeNames);
      local_84 = DnsEntry;
      pVar6 = QMultiMap<QSsl::AlternativeNameEntryType,_QString>::equal_range
                        (&subjectAlternativeNames,&local_84);
      cVar3._M_node = (_Base_ptr)pVar6.first.i._M_node;
      goto LAB_0023438d;
    }
    bVar2 = isMatchingHostname(cn,(QString *)&subjectAlternativeNames_1);
    cn = cn + 1;
    lVar4 = lVar4 + -0x18;
  } while (!bVar2);
  bVar2 = true;
LAB_002343bd:
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)&subjectAlternativeNames_1);
LAB_002343df:
  QHostAddress::~QHostAddress(&hostAddress);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
LAB_0023438d:
  bVar5 = (const_iterator)cVar3._M_node == pVar6.second.i._M_node.i;
  bVar2 = !bVar5;
  if (bVar5) goto LAB_002343b3;
  bVar5 = isMatchingHostname((QString *)&cVar3._M_node[1]._M_parent,
                             (QString *)&subjectAlternativeNames_1);
  if (bVar5) goto LAB_002343b3;
  cVar3._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar3._M_node);
  goto LAB_0023438d;
LAB_002343b3:
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<QSsl::AlternativeNameEntryType,_QString,_std::less<QSsl::AlternativeNameEntryType>,_std::allocator<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&subjectAlternativeNames.d);
  goto LAB_002343bd;
}

Assistant:

bool QSslSocketPrivate::isMatchingHostname(const QSslCertificate &cert, const QString &peerName)
{
    QHostAddress hostAddress(peerName);
    if (!hostAddress.isNull()) {
        const auto subjectAlternativeNames = cert.subjectAlternativeNames();
        const auto ipAddresses = subjectAlternativeNames.equal_range(QSsl::AlternativeNameEntryType::IpAddressEntry);

        for (auto it = ipAddresses.first; it != ipAddresses.second; it++) {
            if (QHostAddress(*it).isEqual(hostAddress, QHostAddress::StrictConversion))
                return true;
        }
    }

    const QString lowerPeerName = QString::fromLatin1(QUrl::toAce(peerName));
    const QStringList commonNames = cert.subjectInfo(QSslCertificate::CommonName);

    for (const QString &commonName : commonNames) {
        if (isMatchingHostname(commonName, lowerPeerName))
            return true;
    }

    const auto subjectAlternativeNames = cert.subjectAlternativeNames();
    const auto altNames = subjectAlternativeNames.equal_range(QSsl::DnsEntry);
    for (auto it = altNames.first; it != altNames.second; ++it) {
        if (isMatchingHostname(*it, lowerPeerName))
            return true;
    }

    return false;
}